

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_request.cc
# Opt level: O3

int __thiscall crail::CreateRequest::Write(CreateRequest *this,ByteBuffer *buffer)

{
  int iVar1;
  
  NamenodeRequest::Write(&this->super_NamenodeRequest,buffer);
  Filename::Write(&this->filename_,buffer);
  ByteBuffer::PutInt(buffer,this->type_);
  ByteBuffer::PutInt(buffer,this->storage_class_);
  ByteBuffer::PutInt(buffer,this->location_class_);
  ByteBuffer::PutInt(buffer,this->enumerable_);
  iVar1 = (*(this->super_NamenodeRequest).super_RpcMessage._vptr_RpcMessage[3])(this);
  return iVar1;
}

Assistant:

int CreateRequest::Write(ByteBuffer &buffer) {
  NamenodeRequest::Write(buffer);
  filename_.Write(buffer);
  buffer.PutInt(type_);
  buffer.PutInt(storage_class_);
  buffer.PutInt(location_class_);
  buffer.PutInt(enumerable_);

  return Size();
}